

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> __thiscall
Assimp::readFile(Assimp *this,IOStream *stream,size_t *size,bool *isFI)

{
  int iVar1;
  undefined4 extraout_var;
  uchar *__p;
  pointer puVar2;
  undefined4 extraout_var_00;
  pointer puVar3;
  size_t sVar4;
  bool *isFI_local;
  size_t *size_local;
  IOStream *stream_local;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *data;
  
  iVar1 = (*stream->_vptr_IOStream[6])();
  *size = CONCAT44(extraout_var,iVar1);
  __p = (uchar *)operator_new__(*size);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)this,__p);
  puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)this);
  iVar1 = (*stream->_vptr_IOStream[2])(stream,puVar2,*size,1);
  if (CONCAT44(extraout_var_00,iVar1) != 1) {
    *size = 0;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::reset
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)this,
               (nullptr_t)0x0);
  }
  puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)this);
  puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)this);
  sVar4 = parseMagic(puVar2,puVar3 + *size);
  *isFI = sVar4 != 0;
  return (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)this;
}

Assistant:

static std::unique_ptr<uint8_t[]> readFile(IOStream *stream, size_t &size, bool &isFI) {
    size = stream->FileSize();
    std::unique_ptr<uint8_t[]> data = std::unique_ptr<uint8_t[]>(new uint8_t[size]);
    if (stream->Read(data.get(), size, 1) != 1) {
        size = 0;
        data.reset();
    }
    isFI = parseMagic(data.get(), data.get() + size) > 0;
    return data;
}